

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Activation.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeActivation(ConvertLayerParameters layerParameters)

{
  Rep *pRVar1;
  string *psVar2;
  int iVar3;
  Type *caffeLayer;
  Type *this;
  ActivationParams *pAVar4;
  Type *pTVar5;
  ActivationPReLU *this_00;
  Type *pTVar6;
  WeightParams *pWVar7;
  ActivationELU *this_01;
  ActivationSoftplus *this_02;
  ReLUParameter *pRVar8;
  void **ppvVar9;
  long lVar10;
  PReLUParameter *pPVar11;
  long lVar12;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  RepeatedPtrFieldBase *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),
                          *(int *)&((top.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p)
  ;
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (in_stack_00000018,(Type *)0x0);
  if (((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Must have 1 input and 1 output","");
    errorInCaffeProto(&local_b8,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  local_40 = in_stack_00000018;
  local_38 = in_stack_00000028;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = (caffeLayer->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  lVar12 = (long)(caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar12 != 0) {
    lVar10 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,*(value_type **)((long)ppvVar9 + lVar10));
      lVar10 = lVar10 + 8;
    } while (lVar12 * 8 != lVar10);
  }
  pRVar1 = (caffeLayer->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  lVar12 = (long)(caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar12 != 0) {
    lVar10 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((long)ppvVar9 + lVar10));
      lVar10 = lVar10 + 8;
    } while (lVar12 * 8 != lVar10);
  }
  convertCaffeMetadata
            ((caffeLayer->name_).ptr_,&local_58,&local_78,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_40,local_38);
  if (this->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this);
    this->_oneof_case_[0] = 0x82;
    pAVar4 = (ActivationParams *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams(pAVar4);
    (this->layer_).activation_ = pAVar4;
  }
  pAVar4 = (this->layer_).activation_;
  iVar3 = std::__cxx11::string::compare((char *)(caffeLayer->type_).ptr_);
  if (iVar3 == 0) {
    pRVar8 = caffeLayer->relu_param_;
    if (pRVar8 == (ReLUParameter *)0x0) {
      pRVar8 = (ReLUParameter *)&caffe::_ReLUParameter_default_instance_;
    }
    if (1e-06 <= ABS(pRVar8->negative_slope_)) {
      if (pAVar4->_oneof_case_[0] != 0xf) {
        CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar4);
        pAVar4->_oneof_case_[0] = 0xf;
        this_01 = (ActivationELU *)operator_new(0x18);
        CoreML::Specification::ActivationLeakyReLU::ActivationLeakyReLU
                  ((ActivationLeakyReLU *)this_01);
LAB_003fa2a0:
        (pAVar4->NonlinearityType_).elu_ = this_01;
      }
LAB_003fa2a4:
      ((pAVar4->NonlinearityType_).linear_)->alpha_ = pRVar8->negative_slope_;
      goto LAB_003fa2e4;
    }
    if (pAVar4->_oneof_case_[0] == 10) goto LAB_003fa2e4;
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar4);
    pAVar4->_oneof_case_[0] = 10;
    this_02 = (ActivationSoftplus *)operator_new(0x18);
    CoreML::Specification::ActivationReLU::ActivationReLU((ActivationReLU *)this_02);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)(caffeLayer->type_).ptr_);
    if (iVar3 == 0) {
      if (pAVar4->_oneof_case_[0] == 0x1e) goto LAB_003fa2e4;
      CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar4);
      pAVar4->_oneof_case_[0] = 0x1e;
      this_02 = (ActivationSoftplus *)operator_new(0x18);
      CoreML::Specification::ActivationTanh::ActivationTanh((ActivationTanh *)this_02);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)(caffeLayer->type_).ptr_);
      if (iVar3 == 0) {
        if (pAVar4->_oneof_case_[0] == 0x28) goto LAB_003fa2e4;
        CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar4);
        pAVar4->_oneof_case_[0] = 0x28;
        this_02 = (ActivationSoftplus *)operator_new(0x18);
        CoreML::Specification::ActivationSigmoid::ActivationSigmoid((ActivationSigmoid *)this_02);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)(caffeLayer->type_).ptr_);
        if (iVar3 == 0) {
          pRVar8 = (ReLUParameter *)caffeLayer->elu_param_;
          if (pRVar8 == (ReLUParameter *)0x0) {
            pRVar8 = (ReLUParameter *)&caffe::_ELUParameter_default_instance_;
          }
          if (pAVar4->_oneof_case_[0] != 0x32) {
            CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar4);
            pAVar4->_oneof_case_[0] = 0x32;
            this_01 = (ActivationELU *)operator_new(0x18);
            CoreML::Specification::ActivationELU::ActivationELU(this_01);
            goto LAB_003fa2a0;
          }
          goto LAB_003fa2a4;
        }
        iVar3 = std::__cxx11::string::compare((char *)(caffeLayer->type_).ptr_);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)(caffeLayer->type_).ptr_);
          if (iVar3 == 0) {
            iVar3 = getLayerIndex(caffeLayer,in_stack_00000030);
            pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                               ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar3);
            pPVar11 = caffeLayer->prelu_param_;
            if (pPVar11 == (PReLUParameter *)0x0) {
              pPVar11 = (PReLUParameter *)&caffe::_PReLUParameter_default_instance_;
            }
            this_00 = CoreML::Specification::ActivationParams::mutable_prelu(pAVar4);
            if ((pTVar5->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,"Parameters (alpha values) not found","");
              psVar2 = (caffeLayer->name_).ptr_;
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"PReLU","");
              errorInCaffeProto(&local_b8,psVar2,&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if (pPVar11->channel_shared_ == true) {
              pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                 (&(pTVar5->blobs_).super_RepeatedPtrFieldBase,0);
              if ((pTVar6->data_).current_size_ != 1) {
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_b8,
                           "Expected a scalar parameter (alpha) when \'channel_shared\' flag is set"
                           ,"");
                psVar2 = (caffeLayer->name_).ptr_;
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"PReLU","");
                errorInCaffeProto(&local_b8,psVar2,&local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p,
                                  local_98.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
              }
            }
            pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                               (&(pTVar5->blobs_).super_RepeatedPtrFieldBase,0);
            iVar3 = (pTVar6->data_).current_size_;
            pWVar7 = CoreML::Specification::ActivationPReLU::mutable_alpha(this_00);
            local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffff00000000;
            google::protobuf::RepeatedField<float>::Resize
                      (&pWVar7->floatvalue_,iVar3,(float *)&local_b8);
            pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                               (&(pTVar5->blobs_).super_RepeatedPtrFieldBase,0);
            google::protobuf::RepeatedField<float>::CopyFrom(&pWVar7->floatvalue_,&pTVar6->data_);
          }
          goto LAB_003fa2e4;
        }
        if (pAVar4->_oneof_case_[0] == 0x46) goto LAB_003fa2e4;
        CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar4);
        pAVar4->_oneof_case_[0] = 0x46;
        this_02 = (ActivationSoftplus *)operator_new(0x18);
        CoreML::Specification::ActivationSoftplus::ActivationSoftplus(this_02);
      }
    }
  }
  (pAVar4->NonlinearityType_).softplus_ = this_02;
LAB_003fa2e4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeActivation(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    Specification::ActivationParams* specLayerParams = specLayer->mutable_activation();
    
    if (caffeLayer.type() == "ReLU"){
        const caffe::ReLUParameter& caffeLayerParams = caffeLayer.relu_param();
        if (std::abs(caffeLayerParams.negative_slope()) < 1e-6f) {
            (void) specLayerParams->mutable_relu();
        } else {
            auto* leakyRelu = specLayerParams->mutable_leakyrelu();
            leakyRelu->set_alpha(caffeLayerParams.negative_slope());
        }
    } else if (caffeLayer.type() == "TanH"){
        (void) specLayerParams->mutable_tanh();
    } else if (caffeLayer.type() == "Sigmoid"){
        (void) specLayerParams->mutable_sigmoid();
    } else if (caffeLayer.type() == "ELU") {
        const caffe::ELUParameter& caffeLayerParams = caffeLayer.elu_param();
        specLayerParams->mutable_elu()->set_alpha(caffeLayerParams.alpha());
    } else if (caffeLayer.type() == "BNLL") {
        (void) specLayerParams->mutable_softplus();
    } else if (caffeLayer.type() == "PReLU") {
        int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
        const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
        const caffe::PReLUParameter& caffeLayerParams = caffeLayer.prelu_param();
        auto* prelu = specLayerParams->mutable_prelu();
        //***************** Some Error Checking in Caffe Proto **********
        if (caffeLayerWeights.blobs_size() == 0){
            CoreMLConverter::errorInCaffeProto("Parameters (alpha values) not found", caffeLayer.name(), "PReLU");
        }
        if (caffeLayerParams.channel_shared()) {
            if (caffeLayerWeights.blobs(0).data_size() != 1){
                CoreMLConverter::errorInCaffeProto("Expected a scalar parameter (alpha) when 'channel_shared' flag is set", caffeLayer.name(), "PReLU");
            }
        }
        //***************************************************************
        int C = caffeLayerWeights.blobs(0).data_size();
        ::google::protobuf::RepeatedField<float>* alpha = prelu->mutable_alpha()->mutable_floatvalue();
        alpha->Resize(C, 0.0);
        alpha->CopyFrom(caffeLayerWeights.blobs(0).data());
    }
    
}